

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase125::run(TestCase125 *this)

{
  StructDataBitCount *this_00;
  Builder reader;
  Reader reader_00;
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Builder builder_03;
  Reader reader_01;
  Builder builder_04;
  Reader reader_02;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  bool bVar1;
  Orphan<capnproto_test::capnp::test::TestAllTypes> *other;
  Builder *value;
  Builder *value_00;
  Builder *value_01;
  Builder *value_02;
  Builder *value_03;
  undefined8 uVar2;
  undefined8 in_stack_fffffffffffff108;
  undefined8 in_stack_fffffffffffff110;
  Builder local_dd8;
  undefined1 local_dc0 [32];
  Reader local_da0;
  ArrayPtr<const_char> local_d58;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_d48;
  uint local_d18 [2];
  bool local_d0d;
  uint local_d0c;
  int iStack_d08;
  bool _kj_shouldLog_7;
  DebugExpression<int> local_d04;
  undefined1 local_d00 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_9;
  bool local_cd5;
  uint local_cd4;
  int iStack_cd0;
  bool _kj_shouldLog_6;
  DebugExpression<int> local_ccc;
  undefined1 local_cc8 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_8;
  bool local_c9d;
  uint local_c9c;
  int iStack_c98;
  bool _kj_shouldLog_5;
  DebugExpression<int> local_c94;
  undefined1 local_c90 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_7;
  Fault local_c68;
  Fault f_1;
  int local_c58;
  DebugExpression<int> local_c54;
  undefined1 local_c50 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_6;
  undefined1 local_c18 [8];
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> l;
  Reader local_bc0;
  ArrayPtr<const_char> local_b78;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_b68;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_b38;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_b10;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_ae8;
  Orphanage local_ac0;
  undefined1 local_ab0 [8];
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> lorphan;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_a78;
  Orphan<capnp::DynamicValue> local_a50;
  ArrayPtr<const_char> local_a18;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_a08;
  Builder local_9d8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_9c0;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_998;
  Reader local_968;
  ArrayPtr<const_char> local_920;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_910;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_8e0;
  Orphanage local_8b8;
  undefined1 local_8a8 [8];
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  BuilderFor<capnp::Text> local_870;
  bool local_851;
  undefined1 local_850 [7];
  bool _kj_shouldLog_4;
  BuilderFor<capnp::Text> local_838;
  char (*local_820) [4];
  undefined1 local_818 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_5;
  Reader local_7d0;
  ArrayPtr<const_char> local_788;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_778;
  uint local_748 [4];
  iterator local_738;
  undefined8 local_730;
  Type local_728;
  Builder local_718;
  BuilderFor<capnp::DynamicList> local_700;
  uint local_6c8 [4];
  iterator local_6b8;
  undefined8 local_6b0;
  Type local_6a8;
  Reader local_698;
  Reader local_668;
  ReaderFor<capnp::DynamicList> local_648;
  uint local_608 [2];
  bool local_5fd;
  uint local_5fc;
  uint uStack_5f8;
  bool _kj_shouldLog_3;
  DebugExpression<unsigned_int> local_5f4;
  undefined1 local_5f0 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_4;
  bool local_5c5;
  uint local_5c4;
  uint uStack_5c0;
  bool _kj_shouldLog_2;
  DebugExpression<unsigned_int> local_5bc;
  undefined1 local_5b8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_3;
  bool local_58d;
  uint local_58c;
  uint uStack_588;
  bool _kj_shouldLog_1;
  DebugExpression<unsigned_int> local_584;
  undefined1 local_580 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_2;
  bool local_555;
  uint local_554;
  uint uStack_550;
  bool _kj_shouldLog;
  DebugExpression<unsigned_int> local_54c;
  undefined1 local_548 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_1;
  Fault local_520;
  Fault f;
  uint local_510;
  DebugExpression<unsigned_int> local_50c;
  undefined1 local_508 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  Reader local_4b8;
  undefined1 local_498 [8];
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> list_1;
  Reader local_420;
  Reader local_3d8;
  Reader local_390;
  Type local_348;
  Builder local_338;
  undefined1 local_320 [8];
  BuilderFor<capnp::DynamicList> list;
  Builder local_2e0;
  BuilderFor<capnp::DynamicStruct> local_2c8;
  Schema local_298;
  Reader local_290;
  Reader local_260;
  ReaderFor<capnp::DynamicStruct> local_240;
  Reader local_208;
  Reader local_1d8;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_1b8;
  Schema local_188;
  Builder local_180;
  BuilderFor<capnp::DynamicStruct> local_168;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase125 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_180,(Builder *)local_128);
  local_188.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  AnyPointer::Builder::initAs<capnp::DynamicStruct>
            (&local_168,&local_180,(StructSchema)local_188.raw);
  builder_03.builder.segment = (SegmentBuilder *)local_168.builder.capTable;
  builder_03.schema.super_Schema.raw = (Schema)(Schema)local_168.builder.segment;
  builder_03.builder.capTable = (CapTableBuilder *)local_168.builder.data;
  builder_03.builder.data = local_168.builder.pointers;
  builder_03.builder.pointers = (WirePointer *)local_168.builder._32_8_;
  builder_03.builder.dataSize = (int)in_stack_fffffffffffff108;
  builder_03.builder.pointerCount = (short)((ulong)in_stack_fffffffffffff108 >> 0x20);
  builder_03.builder._38_2_ = (short)((ulong)in_stack_fffffffffffff108 >> 0x30);
  initDynamicTestMessage(builder_03);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_208,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_1d8,&local_208);
  AnyPointer::Reader::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_1b8,&local_1d8);
  reader_01._reader.capTable = (CapTableReader *)local_1b8._reader.data;
  reader_01._reader.segment = (SegmentReader *)local_1b8._reader.capTable;
  reader_01._reader.data = local_1b8._reader.pointers;
  reader_01._reader.pointers = (WirePointer *)local_1b8._reader._32_8_;
  reader_01._reader.dataSize = local_1b8._reader.nestingLimit;
  reader_01._reader.pointerCount = local_1b8._reader._44_2_;
  reader_01._reader._38_2_ = local_1b8._reader._46_2_;
  reader_01._reader._40_8_ = in_stack_fffffffffffff108;
  checkTestMessage(reader_01);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_290,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_260,&local_290);
  local_298.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  AnyPointer::Reader::getAs<capnp::DynamicStruct>(&local_240,&local_260,(StructSchema)local_298.raw)
  ;
  reader_02.reader.segment = (SegmentReader *)local_240.reader.capTable;
  reader_02.schema.super_Schema.raw = (Schema)(Schema)local_240.reader.segment;
  reader_02.reader.capTable = (CapTableReader *)local_240.reader.data;
  reader_02.reader.data = local_240.reader.pointers;
  reader_02.reader.pointers = (WirePointer *)local_240.reader._32_8_;
  reader_02.reader.dataSize = local_240.reader.nestingLimit;
  reader_02.reader.pointerCount = local_240.reader._44_2_;
  reader_02.reader._38_2_ = local_240.reader._46_2_;
  reader_02.reader._40_8_ = in_stack_fffffffffffff110;
  checkDynamicTestMessage(reader_02);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_2e0,(Builder *)local_128);
  list.builder._32_8_ = Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  AnyPointer::Builder::getAs<capnp::DynamicStruct>
            (&local_2c8,&local_2e0,(StructSchema)list.builder._32_8_);
  builder_04.builder.segment = (SegmentBuilder *)local_2c8.builder.capTable;
  builder_04.schema.super_Schema.raw = (Schema)(Schema)local_2c8.builder.segment;
  builder_04.builder.capTable = (CapTableBuilder *)local_2c8.builder.data;
  builder_04.builder.data = local_2c8.builder.pointers;
  builder_04.builder.pointers = (WirePointer *)local_2c8.builder._32_8_;
  builder_04.builder.dataSize = local_240.reader.nestingLimit;
  builder_04.builder.pointerCount = local_240.reader._44_2_;
  builder_04.builder._38_2_ = local_240.reader._46_2_;
  checkDynamicTestMessage(builder_04);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_338,(Builder *)local_128);
  local_348 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Builder::initAs<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_320,&local_338,(ListSchema)local_348,4);
  DynamicValue::Reader::Reader(&local_390,0x7b);
  DynamicList::Builder::set((Builder *)local_320,0,&local_390);
  DynamicValue::Reader::~Reader(&local_390);
  DynamicValue::Reader::Reader(&local_3d8,0x1c8);
  DynamicList::Builder::set((Builder *)local_320,1,&local_3d8);
  DynamicValue::Reader::~Reader(&local_3d8);
  DynamicValue::Reader::Reader(&local_420,0x315);
  DynamicList::Builder::set((Builder *)local_320,2,&local_420);
  DynamicValue::Reader::~Reader(&local_420);
  DynamicValue::Reader::Reader((Reader *)&list_1.reader.nestingLimit,0x75bcd15);
  DynamicList::Builder::set((Builder *)local_320,3,(Reader *)&list_1.reader.nestingLimit);
  DynamicValue::Reader::~Reader((Reader *)&list_1.reader.nestingLimit);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
            ((Reader *)&_kjCondition.result,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            (&local_4b8,(Reader *)&_kjCondition.result);
  AnyPointer::Reader::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_498,&local_4b8);
  local_510 = 4;
  local_50c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_510);
  f.exception._4_4_ = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_498);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_508,&local_50c,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_508);
  if (!bVar1) {
    _kjCondition_1._28_4_ = 4;
    _kjCondition_1._24_4_ = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_498);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_520,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x95,FAILED,"(4u) == (list.size())","_kjCondition,4u, list.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_508,
               (uint *)&_kjCondition_1.field_0x1c,(uint *)&_kjCondition_1.result);
    kj::_::Debug::Fault::fatal(&local_520);
  }
  uStack_550 = 0x7b;
  local_54c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffab0);
  local_554 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_548,&local_54c,&local_554);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_548);
  if (!bVar1) {
    local_555 = kj::_::Debug::shouldLog(ERROR);
    while (local_555 != false) {
      _kjCondition_2._28_4_ = 0x7b;
      _kjCondition_2._24_4_ =
           List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,0);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x96,ERROR,
                 "\"failed: expected \" \"(123u) == (list[0])\", _kjCondition, 123u, list[0]",
                 (char (*) [37])"failed: expected (123u) == (list[0])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_548,
                 (uint *)&_kjCondition_2.field_0x1c,(uint *)&_kjCondition_2.result);
      local_555 = false;
    }
  }
  uStack_588 = 0x1c8;
  local_584 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffa78);
  local_58c = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,1);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_580,&local_584,&local_58c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_580);
  if (!bVar1) {
    local_58d = kj::_::Debug::shouldLog(ERROR);
    while (local_58d != false) {
      _kjCondition_3._28_4_ = 0x1c8;
      _kjCondition_3._24_4_ =
           List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,1);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x97,ERROR,
                 "\"failed: expected \" \"(456u) == (list[1])\", _kjCondition, 456u, list[1]",
                 (char (*) [37])"failed: expected (456u) == (list[1])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_580,
                 (uint *)&_kjCondition_3.field_0x1c,(uint *)&_kjCondition_3.result);
      local_58d = false;
    }
  }
  uStack_5c0 = 0x315;
  local_5bc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffa40);
  local_5c4 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,2);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_5b8,&local_5bc,&local_5c4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5b8);
  if (!bVar1) {
    local_5c5 = kj::_::Debug::shouldLog(ERROR);
    while (local_5c5 != false) {
      _kjCondition_4._28_4_ = 0x315;
      _kjCondition_4._24_4_ =
           List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,2);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x98,ERROR,
                 "\"failed: expected \" \"(789u) == (list[2])\", _kjCondition, 789u, list[2]",
                 (char (*) [37])"failed: expected (789u) == (list[2])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_5b8,
                 (uint *)&_kjCondition_4.field_0x1c,(uint *)&_kjCondition_4.result);
      local_5c5 = false;
    }
  }
  uStack_5f8 = 0x75bcd15;
  local_5f4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffa08);
  local_5fc = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,3);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_5f0,&local_5f4,&local_5fc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5f0);
  if (!bVar1) {
    local_5fd = kj::_::Debug::shouldLog(ERROR);
    while (local_5fd != false) {
      local_608[1] = 0x75bcd15;
      local_608[0] = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_498,3);
      kj::_::Debug::
      log<char_const(&)[43],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x99,ERROR,
                 "\"failed: expected \" \"(123456789u) == (list[3])\", _kjCondition, 123456789u, list[3]"
                 ,(char (*) [43])"failed: expected (123456789u) == (list[3])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_5f0,local_608 + 1,local_608);
      local_5fd = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_698,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_668,&local_698);
  local_6a8 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Reader::getAs<capnp::DynamicList>(&local_648,&local_668,(ListSchema)local_6a8);
  local_6c8[0] = 0x7b;
  local_6c8[1] = 0x1c8;
  local_6c8[2] = 0x315;
  local_6c8[3] = 0x75bcd15;
  local_6b8 = local_6c8;
  local_6b0 = 4;
  expected_00._M_len = 4;
  expected_00._M_array = local_6b8;
  reader_00.schema.elementType.field_4.schema = local_648.schema.elementType.field_4.schema;
  reader_00.schema.elementType.baseType = local_648.schema.elementType.baseType;
  reader_00.schema.elementType.listDepth = local_648.schema.elementType.listDepth;
  reader_00.schema.elementType.isImplicitParam = local_648.schema.elementType.isImplicitParam;
  reader_00.schema.elementType.field_3 = local_648.schema.elementType.field_3;
  reader_00.schema.elementType._6_2_ = local_648.schema.elementType._6_2_;
  reader_00.reader.segment = local_648.reader.segment;
  reader_00.reader.capTable = local_648.reader.capTable;
  reader_00.reader.ptr = local_648.reader.ptr;
  reader_00.reader.elementCount = local_648.reader.elementCount;
  reader_00.reader.step = local_648.reader.step;
  reader_00.reader.structDataSize = local_648.reader.structDataSize;
  reader_00.reader.structPointerCount = local_648.reader.structPointerCount;
  reader_00.reader.elementSize = local_648.reader.elementSize;
  reader_00.reader._39_1_ = local_648.reader._39_1_;
  reader_00.reader.nestingLimit = local_648.reader.nestingLimit;
  reader_00.reader._44_4_ = local_648.reader._44_4_;
  _::(anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>
            (reader_00,expected_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_718,(Builder *)local_128);
  local_728 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Builder::getAs<capnp::DynamicList>(&local_700,&local_718,(ListSchema)local_728);
  local_748[0] = 0x7b;
  local_748[1] = 0x1c8;
  local_748[2] = 0x315;
  local_748[3] = 0x75bcd15;
  local_738 = local_748;
  local_730 = 4;
  expected._M_len = 4;
  expected._M_array = local_738;
  reader.schema.elementType.field_4.schema = local_700.schema.elementType.field_4.schema;
  reader.schema.elementType.baseType = local_700.schema.elementType.baseType;
  reader.schema.elementType.listDepth = local_700.schema.elementType.listDepth;
  reader.schema.elementType.isImplicitParam = local_700.schema.elementType.isImplicitParam;
  reader.schema.elementType.field_3 = local_700.schema.elementType.field_3;
  reader.schema.elementType._6_2_ = local_700.schema.elementType._6_2_;
  reader.builder.segment = local_700.builder.segment;
  reader.builder.capTable = local_700.builder.capTable;
  reader.builder.ptr = local_700.builder.ptr;
  reader.builder.elementCount = local_700.builder.elementCount;
  reader.builder.step = local_700.builder.step;
  reader.builder.structDataSize = local_700.builder.structDataSize;
  reader.builder.structPointerCount = local_700.builder.structPointerCount;
  reader.builder.elementSize = local_700.builder.elementSize;
  reader.builder._39_1_ = local_700.builder._39_1_;
  _::(anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Builder>(reader,expected);
  toDynamic<capnproto_test::capnp::test::TestAnyPointer::Builder&>
            (&local_778,(capnp *)local_128,value);
  kj::StringPtr::StringPtr((StringPtr *)&local_788,"anyPointerField");
  Text::Reader::Reader((Reader *)&_kjCondition_5.result,"foo");
  DynamicValue::Reader::Reader(&local_7d0,(Reader *)&_kjCondition_5.result);
  DynamicStruct::Builder::set(&local_778,(StringPtr)local_788,&local_7d0);
  DynamicValue::Reader::~Reader(&local_7d0);
  local_820 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_850,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::Text>(&local_838,(Builder *)local_850);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_818,
             (DebugExpression<char_const(&)[4]> *)&local_820,&local_838);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_818);
  uVar2 = local_700.builder._24_8_;
  if (!bVar1) {
    local_851 = kj::_::Debug::shouldLog(ERROR);
    uVar2 = local_700.builder._24_8_;
    while (local_851 != false) {
      capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
                ((Builder *)&orphan.builder.location,(Builder *)local_128);
      AnyPointer::Builder::getAs<capnp::Text>(&local_870,(Builder *)&orphan.builder.location);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xa4,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<Text>())\", _kjCondition, \"foo\", root.getAnyPointerField().getAs<Text>()"
                 ,(char (*) [70])
                  "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<Text>())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_818,
                 (char (*) [4])"foo",&local_870);
      local_851 = false;
    }
  }
  local_8b8 = MessageBuilder::getOrphanage((MessageBuilder *)&root._builder.dataSize);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_8a8,&local_8b8);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::get
            (&local_8e0,(Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_8a8);
  builder_00._builder.capTable = (CapTableBuilder *)local_8e0._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_8e0._builder.capTable;
  builder_00._builder.data = local_8e0._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_8e0._builder._32_8_;
  builder_00._builder._32_8_ = uVar2;
  initTestMessage(builder_00);
  toDynamic<capnproto_test::capnp::test::TestAnyPointer::Builder&>
            (&local_910,(capnp *)local_128,value_00);
  kj::StringPtr::StringPtr((StringPtr *)&local_920,"anyPointerField");
  Orphan<capnproto_test::capnp::test::TestAllTypes>::getReader
            (&local_998,(Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_8a8);
  DynamicValue::Reader::
  Reader<capnproto_test::capnp::test::TestAllTypes::Reader,capnp::DynamicStruct::Reader>
            (&local_968,&local_998);
  DynamicStruct::Builder::set(&local_910,(StringPtr)local_920,&local_968);
  DynamicValue::Reader::~Reader(&local_968);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_9d8,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_9c0,&local_9d8);
  builder_01._builder.capTable = (CapTableBuilder *)local_9c0._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_9c0._builder.capTable;
  builder_01._builder.data = local_9c0._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_9c0._builder._32_8_;
  builder_01._builder._32_8_ = uVar2;
  checkTestMessage(builder_01);
  toDynamic<capnproto_test::capnp::test::TestAnyPointer::Builder&>
            (&local_a08,(capnp *)local_128,value_01);
  kj::StringPtr::StringPtr((StringPtr *)&local_a18,"anyPointerField");
  other = kj::mv<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>>
                    ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_8a8);
  Orphan<capnp::DynamicValue>::Orphan<capnproto_test::capnp::test::TestAllTypes>(&local_a50,other);
  DynamicStruct::Builder::adopt(&local_a08,(StringPtr)local_a18,&local_a50);
  Orphan<capnp::DynamicValue>::~Orphan(&local_a50);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&lorphan.builder.location,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_a78,(Builder *)&lorphan.builder.location);
  builder_02._builder.capTable = (CapTableBuilder *)local_a78._builder.data;
  builder_02._builder.segment = (SegmentBuilder *)local_a78._builder.capTable;
  builder_02._builder.data = local_a78._builder.pointers;
  builder_02._builder.pointers = (WirePointer *)local_a78._builder._32_8_;
  builder_02._builder._32_8_ = uVar2;
  checkTestMessage(builder_02);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_8a8);
  local_ac0 = MessageBuilder::getOrphanage((MessageBuilder *)&root._builder.dataSize);
  Orphanage::newOrphan<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_ab0,&local_ac0,3);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            (&local_ae8,(Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_ab0);
  List<unsigned_int,_(capnp::Kind)0>::Builder::set(&local_ae8,0,0xc);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            (&local_b10,(Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_ab0);
  List<unsigned_int,_(capnp::Kind)0>::Builder::set(&local_b10,1,0x22);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            (&local_b38,(Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_ab0);
  List<unsigned_int,_(capnp::Kind)0>::Builder::set(&local_b38,2,0x38);
  toDynamic<capnproto_test::capnp::test::TestAnyPointer::Builder&>
            (&local_b68,(capnp *)local_128,value_02);
  kj::StringPtr::StringPtr((StringPtr *)&local_b78,"anyPointerField");
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::getReader
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&l.builder.structDataSize,
             (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_ab0);
  DynamicValue::Reader::
  Reader<capnp::List<unsigned_int,(capnp::Kind)0>::Reader,capnp::DynamicList::Reader>
            (&local_bc0,(Reader *)&l.builder.structDataSize);
  DynamicStruct::Builder::set(&local_b68,(StringPtr)local_b78,&local_bc0);
  DynamicValue::Reader::~Reader(&local_bc0);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_6.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_c18,
             (Builder *)&_kjCondition_6.result);
  local_c58 = 3;
  local_c54 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c58);
  f_1.exception._4_4_ = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_c18);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_c50,&local_c54,
             (uint *)((long)&f_1.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c50);
  if (bVar1) {
    iStack_c98 = 0xc;
    local_c94 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff368);
    local_c9c = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_c18,0);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_unsigned_int> *)local_c90,&local_c94,&local_c9c);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c90);
    if (!bVar1) {
      local_c9d = kj::_::Debug::shouldLog(ERROR);
      while (local_c9d != false) {
        _kjCondition_8._28_4_ = 0xc;
        _kjCondition_8._24_4_ =
             List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_c18,0);
        kj::_::Debug::
        log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0xb8,ERROR,"\"failed: expected \" \"(12) == (l[0])\", _kjCondition, 12, l[0]",
                   (char (*) [32])"failed: expected (12) == (l[0])",
                   (DebugComparison<int,_unsigned_int> *)local_c90,(int *)&_kjCondition_8.field_0x1c
                   ,(uint *)&_kjCondition_8.result);
        local_c9d = false;
      }
    }
    iStack_cd0 = 0x22;
    local_ccc = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff330);
    local_cd4 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_c18,1);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_unsigned_int> *)local_cc8,&local_ccc,&local_cd4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_cc8);
    if (!bVar1) {
      local_cd5 = kj::_::Debug::shouldLog(ERROR);
      while (local_cd5 != false) {
        _kjCondition_9._28_4_ = 0x22;
        _kjCondition_9._24_4_ =
             List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_c18,1);
        kj::_::Debug::
        log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0xb9,ERROR,"\"failed: expected \" \"(34) == (l[1])\", _kjCondition, 34, l[1]",
                   (char (*) [32])"failed: expected (34) == (l[1])",
                   (DebugComparison<int,_unsigned_int> *)local_cc8,(int *)&_kjCondition_9.field_0x1c
                   ,(uint *)&_kjCondition_9.result);
        local_cd5 = false;
      }
    }
    iStack_d08 = 0x38;
    local_d04 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff2f8);
    local_d0c = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_c18,2);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_unsigned_int> *)local_d00,&local_d04,&local_d0c);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d00);
    if (!bVar1) {
      local_d0d = kj::_::Debug::shouldLog(ERROR);
      while (local_d0d != false) {
        local_d18[1] = 0x38;
        local_d18[0] = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]
                                 ((Builder *)local_c18,2);
        kj::_::Debug::
        log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0xba,ERROR,"\"failed: expected \" \"(56) == (l[2])\", _kjCondition, 56, l[2]",
                   (char (*) [32])"failed: expected (56) == (l[2])",
                   (DebugComparison<int,_unsigned_int> *)local_d00,(int *)(local_d18 + 1),local_d18)
        ;
        local_d0d = false;
      }
    }
    Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::~Orphan
              ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_ab0);
    toDynamic<capnproto_test::capnp::test::TestAnyPointer::Builder&>
              (&local_d48,(capnp *)local_128,value_03);
    kj::StringPtr::StringPtr((StringPtr *)&local_d58,"anyPointerField");
    Capability::Client::Client((Client *)(local_dc0 + 0x10),(void *)0x0);
    DynamicValue::Reader::Reader<capnp::Capability::Client,capnp::DynamicCapability::Client>
              (&local_da0,(Client *)(local_dc0 + 0x10));
    DynamicStruct::Builder::set(&local_d48,(StringPtr)local_d58,&local_da0);
    DynamicValue::Reader::~Reader(&local_da0);
    Capability::Client::~Client((Client *)(local_dc0 + 0x10));
    capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
              (&local_dd8,(Builder *)local_128);
    AnyPointer::Builder::getAs<capnp::Capability>((Builder *)local_dc0);
    Capability::Client::~Client((Client *)local_dc0);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
    return;
  }
  _kjCondition_7._28_4_ = 3;
  _kjCondition_7._24_4_ = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_c18);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
            (&local_c68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0xb7,FAILED,"(3) == (l.size())","_kjCondition,3, l.size()",
             (DebugComparison<int,_unsigned_int> *)local_c50,(int *)&_kjCondition_7.field_0x1c,
             (uint *)&_kjCondition_7.result);
  kj::_::Debug::Fault::fatal(&local_c68);
}

Assistant:

TEST(DynamicApi, AnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initDynamicTestMessage(
      root.getAnyPointerField().initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.getAnyPointerField().initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(root.asReader().getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(root.getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
  }

  // Setting an AnyPointer to various types should work.
  toDynamic(root).set("anyPointerField", capnp::Text::Reader("foo"));
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());

  {
    auto orphan = builder.getOrphanage().newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    toDynamic(root).set("anyPointerField", orphan.getReader());
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());

    toDynamic(root).adopt("anyPointerField", kj::mv(orphan));
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  }

  {
    auto lorphan = builder.getOrphanage().newOrphan<List<uint32_t>>(3);
    lorphan.get().set(0, 12);
    lorphan.get().set(1, 34);
    lorphan.get().set(2, 56);
    toDynamic(root).set("anyPointerField", lorphan.getReader());
    auto l = root.getAnyPointerField().getAs<List<uint32_t>>();
    ASSERT_EQ(3, l.size());
    EXPECT_EQ(12, l[0]);
    EXPECT_EQ(34, l[1]);
    EXPECT_EQ(56, l[2]);
  }

  // Just compile this one.
  toDynamic(root).set("anyPointerField", Capability::Client(nullptr));
  root.getAnyPointerField().getAs<Capability>();
}